

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_open_filename.c
# Opt level: O0

wchar_t archive_read_open_filename_w(archive *a,wchar_t *wfilename,size_t block_size)

{
  wchar_t wVar1;
  wchar_t *local_38;
  wchar_t *wfilenames [2];
  size_t block_size_local;
  wchar_t *wfilename_local;
  archive *a_local;
  
  wfilenames[0] = (wchar_t *)0x0;
  local_38 = wfilename;
  wVar1 = archive_read_open_filenames_w(a,&local_38,block_size);
  return wVar1;
}

Assistant:

int
archive_read_open_filename_w(struct archive *a, const wchar_t *wfilename,
    size_t block_size)
{
	const wchar_t *wfilenames[2];
	wfilenames[0] = wfilename;
	wfilenames[1] = NULL;
	return archive_read_open_filenames_w(a, wfilenames, block_size);
}